

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O0

QAccessibleInterface * __thiscall QAccessibleWidget::focusChild(QAccessibleWidget *this)

{
  bool bVar1;
  QObject *pQVar2;
  QWidget *pQVar3;
  long lVar4;
  QObject *in_RDI;
  QAccessibleInterface *iface;
  QWidget *fw;
  QWidget *in_stack_fffffffffffffff8;
  QAccessibleInterface *pQVar5;
  
  widget((QAccessibleWidget *)0x7ddcab);
  bVar1 = QWidget::hasFocus(in_stack_fffffffffffffff8);
  if (bVar1) {
    pQVar2 = (QObject *)(**(code **)(*(long *)in_RDI + 0x18))();
    pQVar5 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface(pQVar2);
  }
  else {
    widget((QAccessibleWidget *)0x7ddcde);
    pQVar3 = QWidget::focusWidget((QWidget *)0x7ddce6);
    if (pQVar3 == (QWidget *)0x0) {
      pQVar5 = (QAccessibleInterface *)0x0;
    }
    else {
      widget((QAccessibleWidget *)0x7ddd07);
      bVar1 = isAncestor(in_RDI,(QObject *)0x7ddd14);
      if (bVar1) {
        pQVar5 = (QAccessibleInterface *)
                 QAccessible::queryAccessibleInterface(&pQVar3->super_QObject);
        if (((pQVar5 != (QAccessibleInterface *)0x0) && (pQVar5 != (QAccessibleInterface *)in_RDI))
           && (lVar4 = (**(code **)(*(long *)pQVar5 + 0x30))(), lVar4 != 0)) {
          pQVar5 = (QAccessibleInterface *)(**(code **)(*(long *)pQVar5 + 0x30))();
        }
      }
      else {
        pQVar5 = (QAccessibleInterface *)0x0;
      }
    }
  }
  return pQVar5;
}

Assistant:

QAccessibleInterface *QAccessibleWidget::focusChild() const
{
    if (widget()->hasFocus())
        return QAccessible::queryAccessibleInterface(object());

    QWidget *fw = widget()->focusWidget();
    if (!fw)
        return nullptr;

    if (isAncestor(widget(), fw)) {
        QAccessibleInterface *iface = QAccessible::queryAccessibleInterface(fw);
        if (!iface || iface == this || !iface->focusChild())
            return iface;
        return iface->focusChild();
    }
    return nullptr;
}